

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::QtAutoGen(cmGlobalGenerator *this)

{
  bool bVar1;
  undefined1 local_c0 [8];
  cmQtAutoGenGlobalInitializer initializer;
  cmGlobalGenerator *this_local;
  
  initializer.ExecutableTestOutputs_._M_h._M_single_bucket = (__node_base_ptr)this;
  cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
            ((cmQtAutoGenGlobalInitializer *)local_c0,&this->LocalGenerators);
  bVar1 = cmQtAutoGenGlobalInitializer::generate((cmQtAutoGenGlobalInitializer *)local_c0);
  cmQtAutoGenGlobalInitializer::~cmQtAutoGenGlobalInitializer
            ((cmQtAutoGenGlobalInitializer *)local_c0);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::QtAutoGen()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmQtAutoGenGlobalInitializer initializer(this->LocalGenerators);
  return initializer.generate();
#else
  return true;
#endif
}